

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
~TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
          (TEST_GROUP_CppUTestGroupDoublingFactorCounterTest *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d5ce0;
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->s).bonus_tiles._M_t);
  mahjong::PlayerHand::~PlayerHand(&this->h);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(DoublingFactorCounterTest)
{
	PlayerHand h;
	WiningState s;
	DoubligFactorCounter c { h, s };

	void addPair(Tile tile)
	{
		h.add(tile);
		h.add(tile);
	}

	void addTriplet(Tile tile, bool is_open)
	{
		h.add(tile);
		h.add(tile);
		h.add(tile);

		if (is_open)
		{
			h.bindTriplet({ tile, tile, tile });
		}
	}

	void addSequence(Tile tile, bool is_open)
	{
		auto next_tile = NextTile()(tile);
		auto last_tile = NextTile()(next_tile);

		h.add(tile);
		h.add(next_tile);
		h.add(last_tile);

		if (is_open)
		{
			h.bindSequence({ tile, next_tile, last_tile });
		}
	}

	void addQuad(Tile tile, bool is_open)
	{
		h.add(tile);
		h.add(tile);
		h.add(tile);
		h.add(tile);

		if (is_open)
		{
			h.bindOpenQuad({ tile,tile,tile,tile });
		}
		else
		{
			h.bindClosedQuad({ tile,tile,tile,tile });
		}
	}
}